

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O2

void __thiscall soul::SourceCodeOperations::clear(SourceCodeOperations *this)

{
  CodeLocation local_18;
  
  (this->topLevelNamespace).object = (Namespace *)0x0;
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::clear(&this->allModules);
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::clear(&this->processors);
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::clear(&this->graphs);
  std::
  vector<soul::SourceCodeOperations::ModuleDeclaration,_std::allocator<soul::SourceCodeOperations::ModuleDeclaration>_>
  ::clear(&this->namespaces);
  local_18.sourceCode.object = (SourceCodeText *)0x0;
  local_18.location.data = (char *)0x0;
  CodeLocation::operator=(&this->source,&local_18);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_18.sourceCode);
  AST::Allocator::clear(&this->allocator);
  return;
}

Assistant:

void SourceCodeOperations::clear()
{
    topLevelNamespace.reset();
    allModules.clear();
    processors.clear();
    graphs.clear();
    namespaces.clear();
    source = {};
    allocator.clear();
}